

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

long __thiscall
wasm::Random::
pick<long,signed_char,signed_char,short,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,long first,char args,char args_1,short args_2,short args_3,int args_4,
          int args_5,long args_6,long args_7,uchar args_8,unsigned_short args_9,uint args_10,
          unsigned_long args_11)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar1 = upTo(this,0xd);
  if (uVar1 != 0) {
    uVar2 = (ulong)uVar1;
    if (uVar2 == 1) {
      first = (long)args;
    }
    else if (uVar2 == 2) {
      first = (long)args_1;
    }
    else {
      first = pickGivenNum<long,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                        (this,uVar2 - 3,(long)args_2,args_3,args_4,args_5,args_6,args_7,args_8,
                         args_9,args_10,args_11);
    }
  }
  return first;
}

Assistant:

T pick(T first, Args... args) {
    auto num = sizeof...(Args) + 1;
    auto temp = upTo(num);
    return pickGivenNum<T>(temp, first, args...);
  }